

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExplosionDescriptor.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::ExplosionDescriptor::Decode(ExplosionDescriptor *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  ExplosionDescriptor *this_local;
  
  Descriptor::Decode(&this->super_Descriptor,stream);
  pKVar1 = KDataStream::operator>>(stream,&this->m_ui16ExplMat);
  pKVar1 = KDataStream::operator>>(pKVar1,&this->m_ui16Padding);
  KDataStream::operator>>(pKVar1,(float *)&this->m_f32ExplForce);
  return;
}

Assistant:

void ExplosionDescriptor::Decode(KDataStream &stream) noexcept(false)
{
	Descriptor::Decode( stream );

    stream >> m_ui16ExplMat
           >> m_ui16Padding
           >> m_f32ExplForce;           
}